

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglClientExtensionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::CheckExtensionsTest::iterate(CheckExtensionsTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 errCode;
  Library *pLVar4;
  undefined4 extraout_var;
  EGLDisplay pvVar5;
  undefined4 extraout_var_00;
  iterator iVar6;
  TestError *this_00;
  char *description;
  int extNdx;
  long lVar7;
  pointer_____offset_0x10___ *ppuVar8;
  long lVar9;
  allocator<char> local_271;
  CheckExtensionsTest *local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clientExtensions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  displayExtensions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  knownDisplayExtensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  knownClientExtensions;
  undefined1 local_1b0 [384];
  
  local_270 = this;
  pLVar4 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  iVar3 = (*pLVar4->_vptr_Library[0x2a])(pLVar4,0,0x3055);
  errCode = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<char_const*const*>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&knownClientExtensions,(char **)egl::(anonymous_namespace)::s_clientExtensionList,
             (char **)egl::(anonymous_namespace)::s_displayExtensionList);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<char_const*const*>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&knownDisplayExtensions,(char **)egl::(anonymous_namespace)::s_displayExtensionList,
             (char **)&DAT_01e020b8);
  displayExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  displayExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  displayExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clientExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clientExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clientExtensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (errCode == 0x3000) {
    if ((char *)CONCAT44(extraout_var,iVar3) != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,(char *)CONCAT44(extraout_var,iVar3),&local_271);
      de::splitString(&local_228,(string *)local_1b0,' ');
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&clientExtensions);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
      std::__cxx11::string::~string((string *)local_1b0);
      pvVar5 = eglu::getAndInitDisplay
                         ((((local_270->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,(Version *)0x0);
      iVar3 = (*pLVar4->_vptr_Library[0x2a])(pLVar4,pvVar5,0x3055);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,(char *)CONCAT44(extraout_var_00,iVar3),&local_271);
      de::splitString(&local_228,(string *)local_1b0,' ');
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&displayExtensions,&local_228);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_228);
      std::__cxx11::string::~string((string *)local_1b0);
      (*pLVar4->_vptr_Library[0x34])(pLVar4,pvVar5);
      bVar2 = true;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      lVar9 = 0;
      for (lVar7 = 0;
          lVar7 < (int)((ulong)((long)clientExtensions.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)clientExtensions.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
          lVar7 = lVar7 + 1) {
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&knownDisplayExtensions._M_t,
                       (key_type *)
                       ((long)&((clientExtensions.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar9));
        if ((_Rb_tree_header *)iVar6._M_node !=
            &knownDisplayExtensions._M_t._M_impl.super__Rb_tree_header) {
          local_1b0._0_8_ =
               ((local_270->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"\'");
          std::operator<<((ostream *)poVar1,
                          (string *)
                          ((long)&((clientExtensions.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar9));
          std::operator<<((ostream *)poVar1,"\' is not client extension");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          bVar2 = false;
        }
        lVar9 = lVar9 + 0x20;
      }
      poVar1 = (ostringstream *)(local_1b0 + 8);
      lVar9 = 0;
      for (lVar7 = 0;
          lVar7 < (int)((ulong)((long)displayExtensions.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)displayExtensions.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
          lVar7 = lVar7 + 1) {
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&knownClientExtensions._M_t,
                       (key_type *)
                       ((long)&((displayExtensions.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar9));
        if ((_Rb_tree_header *)iVar6._M_node !=
            &knownClientExtensions._M_t._M_impl.super__Rb_tree_header) {
          local_1b0._0_8_ =
               ((local_270->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"\'");
          std::operator<<((ostream *)poVar1,
                          (string *)
                          ((long)&((displayExtensions.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar9));
          std::operator<<((ostream *)poVar1,"\' is not display extension");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          bVar2 = false;
        }
        lVar9 = lVar9 + 0x20;
      }
      description = "Fail";
      if (bVar2) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((local_270->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar2 & QP_TEST_RESULT_FAIL,description);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&clientExtensions);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&displayExtensions);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&knownDisplayExtensions._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&knownClientExtensions._M_t);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"clientExtensionsStr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
               ,0xcb);
    ppuVar8 = &tcu::TestError::typeinfo;
  }
  else if (errCode == 0x3008) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"EGL_EXT_client_extensions not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
               ,199);
    ppuVar8 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    eglu::Error::Error((Error *)this_00,errCode,"eglQueryString()",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglClientExtensionTests.cpp"
                       ,0xc9);
    ppuVar8 = &eglu::Error::typeinfo;
  }
  __cxa_throw(this_00,ppuVar8,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult CheckExtensionsTest::iterate (void)
{
	const Library&		egl						= m_eglTestCtx.getLibrary();
	bool				isOk					= true;
	const char* const	clientExtensionsStr		= egl.queryString(EGL_NO_DISPLAY, EGL_EXTENSIONS);
	const EGLint		eglQueryError			= egl.getError();

	set<string>			knownClientExtensions	(s_clientExtensionList, s_clientExtensionList + DE_LENGTH_OF_ARRAY(s_clientExtensionList));
	set<string>			knownDisplayExtensions	(s_displayExtensionList, s_displayExtensionList + DE_LENGTH_OF_ARRAY(s_displayExtensionList));

	vector<string>		displayExtensions;
	vector<string>		clientExtensions;

	if (eglQueryError == EGL_BAD_DISPLAY)
		TCU_THROW(NotSupportedError, "EGL_EXT_client_extensions not supported");
	else if (eglQueryError != EGL_SUCCESS)
		throw eglu::Error(eglQueryError, "eglQueryString()", DE_NULL, __FILE__, __LINE__);

	TCU_CHECK(clientExtensionsStr);

	clientExtensions = de::splitString(clientExtensionsStr, ' ');

	{
		EGLDisplay	display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

		displayExtensions = de::splitString(egl.queryString(display, EGL_EXTENSIONS), ' ');

		egl.terminate(display);
	}

	for (int extNdx = 0; extNdx < (int)clientExtensions.size(); extNdx++)
	{
		if (knownDisplayExtensions.find(clientExtensions[extNdx]) != knownDisplayExtensions.end())
		{
			m_testCtx.getLog() << TestLog::Message << "'" << clientExtensions[extNdx] << "' is not client extension" << TestLog::EndMessage;
			isOk = false;
		}
	}

	for (int extNdx = 0; extNdx < (int)displayExtensions.size(); extNdx++)
	{
		if (knownClientExtensions.find(displayExtensions[extNdx]) != knownClientExtensions.end())
		{
			m_testCtx.getLog() << TestLog::Message << "'" << displayExtensions[extNdx] << "' is not display extension" << TestLog::EndMessage;
			isOk = false;
		}
	}

	if (isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	return STOP;
}